

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *hs)

{
  bool bVar1;
  ssl_private_key_result_t sVar2;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = std::operator==(&hs->credential,(nullptr_t)0x0);
  if (bVar1) {
    hs->tls13_state = 0xd;
    hs_local._4_4_ = ssl_hs_ok;
  }
  else {
    sVar2 = tls13_add_certificate_verify(hs);
    if (sVar2 == ssl_private_key_success) {
      hs->tls13_state = 0xd;
      hs_local._4_4_ = ssl_hs_ok;
    }
    else if (sVar2 == ssl_private_key_retry) {
      hs->tls13_state = 0xc;
      hs_local._4_4_ = ssl_hs_private_key_operation;
    }
    else {
      if (sVar2 != ssl_private_key_failure) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                      ,0x3dd,
                      "enum ssl_hs_wait_t bssl::do_send_client_certificate_verify(SSL_HANDSHAKE *)")
        ;
      }
      hs_local._4_4_ = ssl_hs_error;
    }
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_send_client_certificate_verify(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;

  if (!hs->cert_request || hs->credential == nullptr) {
    hs->state = state_send_client_finished;
    return ssl_hs_ok;
  }

  ScopedCBB cbb;
  CBB body, child;
  if (!ssl->method->init_message(ssl, cbb.get(), &body,
                                 SSL3_MT_CERTIFICATE_VERIFY)) {
    return ssl_hs_error;
  }

  assert(hs->signature_algorithm != 0);
  if (ssl_protocol_version(ssl) >= TLS1_2_VERSION) {
    // Write out the digest type in TLS 1.2.
    if (!CBB_add_u16(&body, hs->signature_algorithm)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return ssl_hs_error;
    }
  }

  // Set aside space for the signature.
  const size_t max_sig_len = EVP_PKEY_size(hs->credential->pubkey.get());
  uint8_t *ptr;
  if (!CBB_add_u16_length_prefixed(&body, &child) ||
      !CBB_reserve(&child, &ptr, max_sig_len)) {
    return ssl_hs_error;
  }

  size_t sig_len = max_sig_len;
  switch (ssl_private_key_sign(hs, ptr, &sig_len, max_sig_len,
                               hs->signature_algorithm,
                               hs->transcript.buffer())) {
    case ssl_private_key_success:
      break;
    case ssl_private_key_failure:
      return ssl_hs_error;
    case ssl_private_key_retry:
      hs->state = state_send_client_certificate_verify;
      return ssl_hs_private_key_operation;
  }

  if (!CBB_did_write(&child, sig_len) ||  //
      !ssl_add_message_cbb(ssl, cbb.get())) {
    return ssl_hs_error;
  }

  // The handshake buffer is no longer necessary.
  hs->transcript.FreeBuffer();

  hs->state = state_send_client_finished;
  return ssl_hs_ok;
}